

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

GLuint a__GLCreateShader(int type,char **source)

{
  char **ppcVar1;
  GLuint GVar2;
  GLenum error;
  undefined8 in_RAX;
  long lVar3;
  undefined4 in_register_0000003c;
  char *message;
  GLint status;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  GVar2 = glCreateShader(CONCAT44(in_register_0000003c,type));
  lVar3 = 0;
  do {
    ppcVar1 = source + lVar3;
    lVar3 = lVar3 + 1;
  } while (*ppcVar1 != (char *)0x0);
  glShaderSource(GVar2,(int)lVar3 + -1,source,0);
  error = glGetError();
  if (error == 0) {
    glCompileShader(GVar2);
    error = glGetError();
    if (error == 0) {
      glGetShaderiv(GVar2,0x8b81,&local_14);
      error = glGetError();
      if (error == 0) {
        if (local_14 == 1) {
          return GVar2;
        }
        glGetShaderInfoLog(GVar2,0x400,0,a_gl_error);
        error = glGetError();
        if (error == 0) {
          glDeleteShader(GVar2);
          error = glGetError();
          if (error == 0) {
            return 0;
          }
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1169: glDeleteShader(shader) returned "
          ;
        }
        else {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1168: glGetShaderInfoLog(shader, sizeof(a_gl_error), 0, a_gl_error) returned "
          ;
        }
      }
      else {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1166: glGetShaderiv(shader, GL_COMPILE_STATUS, &status) returned "
        ;
      }
    }
    else {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1162: glCompileShader(shader) returned "
      ;
    }
  }
  else {
    message = 
    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1161: glShaderSource(shader, n, (const GLchar **)source, 0) returned "
    ;
  }
  a__GlPrintError(message,error);
  abort();
}

Assistant:

static GLuint a__GLCreateShader(int type, const char *const *source) {
	int n;
	GLuint shader = glCreateShader(type);

	for (n = 0; source[n] != 0; ++n)
		;

	AGL__CALL(glShaderSource(shader, n, (const GLchar **)source, 0));
	AGL__CALL(glCompileShader(shader));

	{
		GLint status;
		AGL__CALL(glGetShaderiv(shader, GL_COMPILE_STATUS, &status));
		if (status != GL_TRUE) {
			AGL__CALL(glGetShaderInfoLog(shader, sizeof(a_gl_error), 0, a_gl_error));
			AGL__CALL(glDeleteShader(shader));
			shader = 0;
		}
	}

	return shader;
}